

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountOverJoin.cpp
# Opt level: O3

void __thiscall
CountOverJoin::valueCount(CountOverJoin *this,Union *factorisationNode,DTreeNode *dTreeNode)

{
  uint uVar1;
  DTreeNode *dTreeNode_00;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  DTreeNode **ppDVar6;
  ulong uVar7;
  
  if (dTreeNode->_caching == true) {
    if (this->cachedCounts[factorisationNode->cacheIndex] != 0) {
      return;
    }
    this->cachedCounts[factorisationNode->cacheIndex] = 1;
  }
  uVar2 = factorisationNode->numberOfValues;
  this->numberOfValues = this->numberOfValues + uVar2;
  if (uVar2 != 0) {
    uVar1 = dTreeNode->_numOfChildren;
    lVar4 = 0;
    uVar5 = 0;
    do {
      lVar3 = lVar4;
      ppDVar6 = &dTreeNode->_firstChild;
      uVar7 = (ulong)uVar1;
      if (0 < (int)uVar1) {
        do {
          dTreeNode_00 = *ppDVar6;
          valueCount(this,*(Union **)((long)factorisationNode->children + lVar3),dTreeNode_00);
          ppDVar6 = &dTreeNode_00->_next;
          lVar3 = lVar3 + 8;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
        uVar2 = factorisationNode->numberOfValues;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + (long)(int)uVar1 * 8;
    } while (uVar5 < uVar2);
  }
  return;
}

Assistant:

void CountOverJoin::valueCount(node::Union* factorisationNode, DTreeNode* dTreeNode)
{
    if (dTreeNode->_caching)
    {
        if (cachedCounts[factorisationNode->cacheIndex] > 0)
            return;

        cachedCounts[factorisationNode->cacheIndex] = 1;
    }

    numberOfValues += factorisationNode->numberOfValues;

    int numOfChildren = dTreeNode -> _numOfChildren;
    for (unsigned long val = 0; val < factorisationNode->numberOfValues; ++val)
    {
        DTreeNode* child = dTreeNode->_firstChild; 
        for (int i = 0; i < numOfChildren; ++i)
        {
            valueCount(factorisationNode->children[val * numOfChildren + i], child);
            child = child->_next;
        }
    }
}